

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O3

int __thiscall
kj::UnixEventPort::poll(UnixEventPort *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined7 extraout_var;
  SignalPromiseAdapter *pSVar4;
  int n;
  Fault f_3;
  Fault f;
  siginfo_t siginfo;
  epoll_event events [16];
  int local_1c4;
  int local_1c0 [2];
  int *local_1b8;
  siginfo_t *psStack_1b0;
  char *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198;
  timespec local_188;
  siginfo_t local_178;
  sigset_t local_f8;
  
  this->sleeping = false;
  if ((this->childSet).ptr.ptr != (ChildSet *)0x0 || this->signalHead != (SignalPromiseAdapter *)0x0
     ) {
    do {
      iVar2 = sigemptyset(&local_f8);
      if (-1 < iVar2) goto LAB_0049ac1e;
      iVar2 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    if (iVar2 != 0) {
      local_1b8 = (int *)0x0;
      local_178.si_signo = 0;
      local_178.si_errno = 0;
      local_178.si_code = 0;
      local_178.__pad0 = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_1b8,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_1b8);
    }
LAB_0049ac1e:
    pSVar4 = this->signalHead;
    iVar2 = 0;
    if (pSVar4 != (SignalPromiseAdapter *)0x0) {
LAB_0049ac31:
      do {
        iVar3 = sigaddset(&local_f8,pSVar4->signum);
        if (iVar3 < 0) {
          iVar3 = kj::_::Debug::getOsErrorNumber(false);
          if (iVar3 == -1) goto LAB_0049ac31;
          if (iVar3 != 0) {
            local_1b8 = (int *)0x0;
            local_178.si_signo = 0;
            local_178.si_errno = 0;
            local_178.si_code = 0;
            local_178.__pad0 = 0;
            kj::_::Debug::Fault::init
                      ((Fault *)&local_1b8,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                      );
            kj::_::Debug::Fault::fatal((Fault *)&local_1b8);
          }
        }
        iVar2 = iVar2 + 1;
        pSVar4 = pSVar4->next;
      } while (pSVar4 != (SignalPromiseAdapter *)0x0);
    }
    if ((this->childSet).ptr.ptr != (ChildSet *)0x0) {
      do {
        iVar3 = sigaddset(&local_f8,0x11);
        if (-1 < iVar3) goto LAB_0049ac97;
        iVar3 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar3 == -1);
      if (iVar3 != 0) {
        local_1b8 = (int *)0x0;
        local_178.si_signo = 0;
        local_178.si_errno = 0;
        local_178.si_code = 0;
        local_178.__pad0 = 0;
        kj::_::Debug::Fault::init
                  ((Fault *)&local_1b8,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                  );
        kj::_::Debug::Fault::fatal((Fault *)&local_1b8);
      }
LAB_0049ac97:
      iVar2 = iVar2 + 1;
    }
    if (iVar2 != 0) {
      do {
        local_188.tv_sec = 0;
        local_188.tv_nsec = 0;
        do {
          local_1c4 = sigtimedwait(&local_f8,(siginfo_t *)&local_178,&local_188);
          if (-1 < local_1c4) goto LAB_0049acf7;
          iVar3 = kj::_::Debug::getOsErrorNumber(true);
        } while (iVar3 == -1);
        if (iVar3 != 0) {
          local_1c0[0] = 0;
          local_1c0[1] = 0;
          local_1b8 = (int *)0x0;
          psStack_1b0 = (siginfo_t *)0x0;
          kj::_::Debug::Fault::init
                    ((Fault *)local_1c0,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                    );
          kj::_::Debug::Fault::fatal((Fault *)local_1c0);
        }
        if (local_1c4 < 0) break;
LAB_0049acf7:
        local_1b8 = &local_1c4;
        local_1a8 = " == ";
        local_198 = local_1c4 == local_178.si_signo;
        local_1a0 = 5;
        psStack_1b0 = &local_178;
        if (!(bool)local_198) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int&>&>
                    ((Fault *)local_1c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                     ,0x2ca,FAILED,"n == siginfo.si_signo","_kjCondition,",
                     (DebugComparison<int_&,_int_&> *)&local_1b8);
          kj::_::Debug::Fault::fatal((Fault *)local_1c0);
        }
        gotSignal(this,&local_178);
        do {
          iVar3 = sigdelset(&local_f8,local_1c4);
          if (-1 < iVar3) goto LAB_0049ad52;
          iVar3 = kj::_::Debug::getOsErrorNumber(false);
        } while (iVar3 == -1);
        if (iVar3 != 0) {
          local_1c0[0] = 0;
          local_1c0[1] = 0;
          local_1b8 = (int *)0x0;
          psStack_1b0 = (siginfo_t *)0x0;
          kj::_::Debug::Fault::init
                    ((Fault *)local_1c0,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                    );
          kj::_::Debug::Fault::fatal((Fault *)local_1c0);
        }
LAB_0049ad52:
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
  }
  do {
    iVar2 = epoll_wait((this->epollFd).fd,(epoll_event *)&local_f8,0x10,0);
    if (-1 < iVar2) goto LAB_0049ad91;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    local_1b8 = (int *)0x0;
    local_178.si_signo = 0;
    local_178.si_errno = 0;
    local_178.si_code = 0;
    local_178.__pad0 = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_1b8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_1b8);
  }
LAB_0049ad91:
  bVar1 = processEpollEvents(this,(epoll_event *)&local_f8,iVar2);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool UnixEventPort::poll() {
  // Unfortunately, epoll_pwait() with a timeout of zero will never deliver actually deliver any
  // pending signals. Therefore, we need a completely different approach to poll for signals. We
  // might as well use regular epoll_wait() in this case, too, to save the kernel some effort.

  sleeping = false;

  if (signalHead != nullptr || childSet != kj::none) {
    // Use sigtimedwait() to poll for signals.

    // Construct a sigset of all signals we are interested in.
    sigset_t sigset;
    KJ_SYSCALL(sigemptyset(&sigset));
    uint count = 0;

    {
      auto ptr = signalHead;
      while (ptr != nullptr) {
        KJ_SYSCALL(sigaddset(&sigset, ptr->signum));
        ++count;
        ptr = ptr->next;
      }
      if (childSet != kj::none) {
        KJ_SYSCALL(sigaddset(&sigset, SIGCHLD));
        ++count;
      }
    }

    // While that set is non-empty, poll for signals.
    while (count > 0) {
      struct timespec timeout;
      timeout.tv_sec = 0;
      timeout.tv_nsec = 0;

      siginfo_t siginfo;
      int n;
      KJ_NONBLOCKING_SYSCALL(n = sigtimedwait(&sigset, &siginfo, &timeout));
      if (n < 0) break;  // EAGAIN: no signals in set are raised

      KJ_ASSERT(n == siginfo.si_signo);
      gotSignal(siginfo);

      // Remove that signal from the set so we don't receive it again, but keep checking for others
      // if there are any.
      KJ_SYSCALL(sigdelset(&sigset, n));
      --count;
    }
  }

  struct epoll_event events[16];
  int n;
  KJ_SYSCALL(n = epoll_wait(epollFd, events, kj::size(events), 0));

  return processEpollEvents(events, n);
}